

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-problem-builder.h
# Opt level: O2

void __thiscall MockProblemBuilder::MockProblemBuilder(MockProblemBuilder *this)

{
  testing::internal::FunctionMocker<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>::
  FunctionMocker(&this->gmock1_suffixes_146);
  testing::internal::FunctionMocker<int_()>::FunctionMocker(&this->gmock0_num_vars_148);
  testing::internal::FunctionMocker<int_()>::FunctionMocker(&this->gmock0_num_algebraic_cons_149);
  testing::internal::FunctionMocker<int_()>::FunctionMocker(&this->gmock0_num_logical_cons_150);
  testing::internal::FunctionMocker<void_(const_mp::NLProblemInfo_&)>::FunctionMocker
            (&this->gmock1_SetInfo_152);
  testing::internal::FunctionMocker<void_()>::FunctionMocker(&this->gmock0_EndBuild_153);
  testing::internal::FunctionMocker<void_(double,_double,_mp::var::Type)>::FunctionMocker
            (&this->gmock3_AddVar_155);
  testing::internal::FunctionMocker<void_(int,_mp::var::Type)>::FunctionMocker
            (&this->gmock2_AddVars_156);
  testing::internal::FunctionMocker<void_(mp::obj::Type)>::FunctionMocker(&this->gmock1_AddObj_160);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker(&this->gmock1_AddObjs_161);
  testing::internal::FunctionMocker<void_(double,_double)>::FunctionMocker(&this->gmock2_AddCon_165)
  ;
  testing::internal::FunctionMocker<void_(BasicTestExpr<2>)>::FunctionMocker
            (&this->gmock1_AddCon_166);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker(&this->gmock1_AddAlgebraicCons_167);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker(&this->gmock1_AddLogicalCons_168);
  testing::internal::FunctionMocker<MockProblemBuilder::MutCommonExpr_&(int)>::FunctionMocker
            (&this->gmock1_common_expr_183);
  testing::internal::FunctionMocker<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock1_AddCommonExpr_185);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker(&this->gmock1_AddCommonExprs_186);
  testing::internal::FunctionMocker<void_(int,_int,_mp::ComplInfo)>::FunctionMocker
            (&this->gmock3_SetComplementarity_189);
  testing::internal::FunctionMocker<MockProblemBuilder::MutVariable_&(int)>::FunctionMocker
            (&this->gmock1_var_200);
  testing::internal::FunctionMocker<MockProblemBuilder::Objective_&(int)>::FunctionMocker
            (&this->gmock1_obj_210);
  testing::internal::FunctionMocker<MockProblemBuilder::AlgebraicCon_&(int)>::FunctionMocker
            (&this->gmock1_algebraic_con_222);
  testing::internal::FunctionMocker<MockProblemBuilder::LogicalCon_&(int)>::FunctionMocker
            (&this->gmock1_logical_con_229);
  testing::internal::FunctionMocker<TestColumnSizeHandler_()>::FunctionMocker
            (&this->gmock0_GetColumnSizeHandler_233);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker(&this->gmock1_AddFunctions_235);
  testing::internal::FunctionMocker<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
  FunctionMocker(&this->gmock3_AddFunction_238);
  testing::internal::
  FunctionMocker<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::FunctionMocker
            (&this->gmock4_DefineFunction_241);
  testing::internal::FunctionMocker<TestFunction_(int)>::FunctionMocker(&this->gmock1_function_243);
  testing::internal::FunctionMocker<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  FunctionMocker(&this->gmock3_AddIntSuffix_249);
  testing::internal::
  FunctionMocker<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
  FunctionMocker(&this->gmock3_AddDblSuffix_255);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(double)>::FunctionMocker
            (&this->gmock1_MakeNumericConstant_260);
  testing::internal::FunctionMocker<TestReference_(int)>::FunctionMocker
            (&this->gmock1_MakeVariable_261);
  testing::internal::FunctionMocker<TestReference_(int)>::FunctionMocker
            (&this->gmock1_MakeCommonExpr_262);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock2_MakeUnary_263);
  testing::internal::
  FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock3_MakeBinary_266);
  testing::internal::
  FunctionMocker<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock3_MakeIf_270);
  testing::internal::FunctionMocker<TestPLTermBuilder_(int)>::FunctionMocker
            (&this->gmock1_BeginPLTerm_274);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock2_EndPLTerm_275);
  testing::internal::FunctionMocker<TestCallExprBuilder_(TestFunction,_int)>::FunctionMocker
            (&this->gmock2_BeginCall_279);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestCallExprBuilder)>::FunctionMocker
            (&this->gmock1_EndCall_280);
  testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  FunctionMocker(&this->gmock2_BeginIterated_285);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  FunctionMocker(&this->gmock1_EndIterated_286);
  testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::FunctionMocker
            (&this->gmock1_BeginSum_288);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  FunctionMocker(&this->gmock1_EndSum_289);
  testing::internal::FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::FunctionMocker
            (&this->gmock1_BeginCount_293);
  testing::internal::FunctionMocker<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  FunctionMocker(&this->gmock1_EndCount_294);
  testing::internal::FunctionMocker<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock2_BeginNumberOf_299);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  FunctionMocker(&this->gmock1_EndNumberOf_300);
  testing::internal::FunctionMocker<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
  FunctionMocker(&this->gmock2_BeginSymbolicNumberOf_305);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  FunctionMocker(&this->gmock1_EndSymbolicNumberOf_307);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::FunctionMocker
            (&this->gmock1_MakeLogicalConstant_309);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)>::FunctionMocker
            (&this->gmock1_MakeNot_310);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  FunctionMocker(&this->gmock3_MakeBinaryLogical_313);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker(&this->gmock3_MakeRelational_316);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::FunctionMocker
            (&this->gmock3_MakeLogicalCount_319);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  FunctionMocker(&this->gmock3_MakeImplication_322);
  testing::internal::FunctionMocker<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  FunctionMocker(&this->gmock2_BeginIteratedLogical_327);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  FunctionMocker(&this->gmock1_EndIteratedLogical_329);
  testing::internal::FunctionMocker<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  FunctionMocker(&this->gmock2_BeginPairwise_334);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  FunctionMocker(&this->gmock1_EndPairwise_335);
  testing::internal::FunctionMocker<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::FunctionMocker
            (&this->gmock1_MakeStringLiteral_337);
  testing::internal::
  FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
  FunctionMocker(&this->gmock3_MakeSymbolicIf_340);
  testing::internal::FunctionMocker<MockProblemBuilder_&()>::FunctionMocker
            (&this->gmock0_problem_342);
  return;
}

Assistant:

MockProblemBuilder() {}